

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  bool bVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pPixels;
  uint uVar3;
  conversion_type conv_type;
  ulong uVar4;
  crn_comp_params *pcVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint level_index;
  ulong uVar11;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar12;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar13;
  long lVar14;
  ulong uVar15;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  image_u8 cooked_image;
  
  piVar12 = this->m_images[0];
  pcVar5 = this->m_pParams;
  lVar14 = 0x28;
  uVar4 = 0;
  piVar13 = piVar12;
  while( true ) {
    uVar2 = pcVar5->m_faces;
    if (uVar2 <= uVar4) break;
    this_00 = piVar13;
    for (uVar11 = 0; uVar11 < pcVar5->m_levels; uVar11 = uVar11 + 1) {
      pPixels = *(color_quad<unsigned_char,_int> **)
                 ((long)(pcVar5->m_pImages + -1) + 0x58 + uVar11 * 8 + lVar14);
      if (pPixels == (color_quad<unsigned_char,_int> *)0x0) goto LAB_0015199b;
      uVar3 = pcVar5->m_height >> ((byte)uVar11 & 0x1f);
      uVar6 = pcVar5->m_width >> ((byte)uVar11 & 0x1f);
      image<crnlib::color_quad<unsigned_char,_int>_>::alias
                (this_00,pPixels,uVar6 + (uVar6 == 0),uVar3 + (uVar3 == 0),0xffffffff,0xf);
      pcVar5 = this->m_pParams;
      this_00 = this_00 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar14 = lVar14 + 0x80;
    piVar13 = piVar13 + 0x10;
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(pcVar5->m_format);
  pcVar5 = this->m_pParams;
  if (conv_type != cConversion_Invalid) {
    for (uVar11 = 0; uVar11 < pcVar5->m_faces; uVar11 = uVar11 + 1) {
      piVar13 = piVar12;
      for (uVar15 = 0; uVar15 < pcVar5->m_levels; uVar15 = uVar15 + 1) {
        image<crnlib::color_quad<unsigned_char,_int>_>::image(&cooked_image,piVar13);
        image_utils::convert_image(&cooked_image,conv_type);
        image<crnlib::color_quad<unsigned_char,_int>_>::swap(piVar13,&cooked_image);
        vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&cooked_image.m_pixel_buf);
        pcVar5 = this->m_pParams;
        piVar13 = piVar13 + 1;
      }
      piVar12 = piVar12 + 0x10;
    }
  }
  vector<crnlib::crn_comp::level_details>::resize(&this->m_levels,pcVar5->m_levels,false);
  this->m_total_blocks = 0;
  pcVar5 = this->m_pParams;
  uVar3 = pcVar5->m_levels;
  bVar1 = this->m_has_subblocks;
  puVar7 = &((this->m_levels).m_p)->block_width;
  uVar8 = 0;
  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
    uVar10 = pcVar5->m_height >> ((byte)uVar11 & 0x1f);
    uVar6 = pcVar5->m_width >> ((byte)uVar11 & 0x1f);
    uVar6 = (uVar6 + 7 + (uint)(uVar6 == 0) & 0xfffffff8) >> (2 - (bVar1 & 1U) & 0x1f);
    *puVar7 = uVar6;
    ((level_details *)(puVar7 + -2))->first_block = uVar8;
    uVar9 = uVar6 * (uVar10 + 7 + (uint)(uVar10 == 0) >> 2 & 0xfffffffe) * pcVar5->m_faces;
    puVar7[-1] = uVar9;
    uVar8 = uVar8 + uVar9;
    this->m_total_blocks = uVar8;
    puVar7 = puVar7 + 3;
  }
LAB_0015199b:
  return uVar2 <= uVar4;
}

Assistant:

bool crn_comp::alias_images()
    {
        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
                const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
                if (!m_pParams->m_pImages[face_index][level_index])
                {
                    return false;
                }
                m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
            }
        }

        image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
        if (conv_type != image_utils::cConversion_Invalid)
        {
            for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
            {
                for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
                {
                    image_u8 cooked_image(m_images[face_index][level_index]);
                    image_utils::convert_image(cooked_image, conv_type);
                    m_images[face_index][level_index].swap(cooked_image);
                }
            }
        }

        m_levels.resize(m_pParams->m_levels);
        m_total_blocks = 0;
        for (uint level = 0; level < m_pParams->m_levels; level++)
        {
            uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
            m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
            m_levels[level].first_block = m_total_blocks;
            m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
            m_total_blocks += m_levels[level].num_blocks;
        }

        return true;
    }